

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O1

bool bssl::ssl_encrypt_ticket(SSL_HANDSHAKE *hs,CBB *out,SSL_SESSION *session)

{
  SSL *pSVar1;
  SSL_TICKET_AEAD_METHOD *pSVar2;
  _Head_base<0UL,_ssl_ctx_st_*,_false> ctx;
  UniquePtr<bssl::TicketKey> UVar3;
  bool bVar4;
  byte bVar5;
  _Head_base<0UL,_unsigned_char_*,_false> in;
  bool bVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  EVP_CIPHER *cipher;
  EVP_MD *md;
  uint8_t *data;
  size_t sVar10;
  bool bVar11;
  int len;
  uint8_t *ptr_1;
  UniquePtr<uint8_t> free_session_buf;
  uint8_t iv [16];
  size_t session_len;
  uint8_t *session_buf;
  uint8_t key_name [16];
  ScopedHMAC_CTX hctx;
  uint8_t *ptr;
  uint local_184;
  uchar *local_180;
  CRYPTO_MUTEX *local_178;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_170;
  uint8_t local_168 [16];
  ulong local_158;
  _Head_base<0UL,_unsigned_char_*,_false> local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  HMAC_CTX local_130;
  EVP_CIPHER_CTX local_c8;
  
  local_150._M_head_impl = (uchar *)0x0;
  iVar7 = SSL_SESSION_to_bytes_for_ticket(session,&local_150._M_head_impl,&local_158);
  in._M_head_impl = local_150._M_head_impl;
  if (iVar7 == 0) {
    return false;
  }
  local_170._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)local_150._M_head_impl;
  pSVar1 = hs->ssl;
  pSVar2 = ((pSVar1->session_ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
            _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->ticket_aead_method;
  if (pSVar2 != (SSL_TICKET_AEAD_METHOD *)0x0) {
    uVar9 = (*pSVar2->max_overhead)(pSVar1);
    if (CARRY8(uVar9,local_158)) {
      bVar11 = false;
      ERR_put_error(0x10,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_session.cc"
                    ,0x194);
    }
    else {
      iVar7 = CBB_reserve(out,(uint8_t **)&local_c8,uVar9 + local_158);
      if (iVar7 == 0) {
        bVar11 = false;
      }
      else {
        iVar7 = (*pSVar2->seal)(pSVar1,(uint8_t *)local_c8.cipher,(size_t *)&local_130,
                                uVar9 + local_158,in._M_head_impl,local_158);
        if (iVar7 == 0) {
          bVar11 = false;
          ERR_put_error(0x10,0,0x114,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_session.cc"
                        ,0x19f);
        }
        else {
          iVar7 = CBB_did_write(out,(size_t)local_130.md);
          bVar11 = iVar7 != 0;
        }
      }
    }
    goto LAB_0015fed1;
  }
  EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&local_c8);
  HMAC_CTX_init((HMAC_CTX *)&local_130);
  bVar11 = true;
  if (local_158 < 0xff80) {
    ctx._M_head_impl =
         (hs->ssl->session_ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t
         .super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
    if ((ctx._M_head_impl)->ticket_key_cb ==
        (_func_int_SSL_ptr_uint8_t_ptr_uint8_t_ptr_EVP_CIPHER_CTX_ptr_HMAC_CTX_ptr_int *)0x0) {
      bVar6 = ssl_ctx_rotate_ticket_encryption_key(ctx._M_head_impl);
      bVar11 = false;
      if (bVar6) {
        local_178 = &(ctx._M_head_impl)->lock;
        CRYPTO_MUTEX_lock_read(local_178);
        iVar7 = RAND_bytes(local_168,0x10);
        if (iVar7 != 0) {
          cipher = EVP_aes_128_cbc();
          iVar7 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)&local_c8,cipher,(ENGINE *)0x0,
                                     (uchar *)((long)((ctx._M_head_impl)->ticket_key_current)._M_t +
                                              0x20),local_168);
          if (iVar7 != 0) {
            UVar3._M_t.super___uniq_ptr_impl<bssl::TicketKey,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bssl::TicketKey_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bssl::TicketKey_*,_false>._M_head_impl =
                 ((ctx._M_head_impl)->ticket_key_current)._M_t;
            md = EVP_sha256();
            iVar7 = HMAC_Init_ex((HMAC_CTX *)&local_130,
                                 (void *)((long)UVar3._M_t.
                                                super___uniq_ptr_impl<bssl::TicketKey,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_bssl::TicketKey_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_bssl::TicketKey_*,_false>.
                                                _M_head_impl + 0x10),0x10,md,(ENGINE *)0x0);
            if (iVar7 != 0) {
              UVar3._M_t.super___uniq_ptr_impl<bssl::TicketKey,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bssl::TicketKey_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bssl::TicketKey_*,_false>._M_head_impl =
                   ((ctx._M_head_impl)->ticket_key_current)._M_t;
              local_148 = *(undefined8 *)
                           UVar3._M_t.
                           super___uniq_ptr_impl<bssl::TicketKey,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_bssl::TicketKey_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bssl::TicketKey_*,_false>._M_head_impl;
              uStack_140 = *(undefined8 *)
                            ((long)UVar3._M_t.
                                   super___uniq_ptr_impl<bssl::TicketKey,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_bssl::TicketKey_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_bssl::TicketKey_*,_false>._M_head_impl + 8
                            );
              bVar6 = false;
              CRYPTO_MUTEX_unlock_read(local_178);
              goto LAB_0015fdfb;
            }
          }
        }
        CRYPTO_MUTEX_unlock_read(local_178);
      }
    }
    else {
      iVar7 = (*(ctx._M_head_impl)->ticket_key_cb)
                        (hs->ssl,(uint8_t *)&local_148,local_168,&local_c8,&local_130,1);
      bVar5 = ~(byte)((uint)iVar7 >> 0x18);
      bVar6 = (bool)(bVar5 >> 7);
      bVar11 = (bool)(bVar5 >> 7);
      if (0 < iVar7) {
LAB_0015fdfb:
        iVar7 = CBB_add_bytes(out,(uint8_t *)&local_148,0x10);
        bVar11 = false;
        if (iVar7 != 0) {
          uVar8 = EVP_CIPHER_CTX_iv_length((EVP_CIPHER_CTX *)&local_c8);
          iVar7 = CBB_add_bytes(out,local_168,(ulong)uVar8);
          if ((iVar7 != 0) &&
             (iVar7 = CBB_reserve(out,&local_180,local_158 + 0x20), bVar11 = false, iVar7 != 0)) {
            iVar7 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)&local_c8,local_180,(int *)&local_184,
                                      in._M_head_impl,(int)local_158);
            if (iVar7 == 0) {
              bVar4 = false;
              bVar11 = false;
              sVar10 = 0;
            }
            else {
              sVar10 = (size_t)(int)local_184;
              iVar7 = EVP_EncryptFinal_ex((EVP_CIPHER_CTX *)&local_c8,local_180 + sVar10,
                                          (int *)&local_184);
              if (iVar7 == 0) {
                bVar4 = false;
                bVar11 = false;
              }
              else {
                sVar10 = sVar10 + (long)(int)local_184;
                bVar4 = true;
                bVar11 = bVar6;
              }
            }
            if (bVar4) {
              iVar7 = CBB_did_write(out,sVar10);
              if (iVar7 == 0) {
                bVar11 = false;
              }
              else {
                data = CBB_data(out);
                sVar10 = CBB_len(out);
                iVar7 = HMAC_Update((HMAC_CTX *)&local_130,data,sVar10);
                bVar11 = false;
                if (((iVar7 != 0) && (iVar7 = CBB_reserve(out,&local_180,0x40), iVar7 != 0)) &&
                   (iVar7 = HMAC_Final((HMAC_CTX *)&local_130,local_180,&local_184), iVar7 != 0)) {
                  iVar7 = CBB_did_write(out,(ulong)local_184);
                  bVar11 = iVar7 != 0;
                }
              }
            }
          }
        }
      }
    }
  }
  HMAC_CTX_cleanup((HMAC_CTX *)&local_130);
  EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_c8);
LAB_0015fed1:
  std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_170);
  return bVar11;
}

Assistant:

bool ssl_encrypt_ticket(SSL_HANDSHAKE *hs, CBB *out,
                        const SSL_SESSION *session) {
  // Serialize the SSL_SESSION to be encoded into the ticket.
  uint8_t *session_buf = nullptr;
  size_t session_len;
  if (!SSL_SESSION_to_bytes_for_ticket(session, &session_buf, &session_len)) {
    return false;
  }
  bssl::UniquePtr<uint8_t> free_session_buf(session_buf);

  if (hs->ssl->session_ctx->ticket_aead_method) {
    return ssl_encrypt_ticket_with_method(hs, out, session_buf, session_len);
  } else {
    return ssl_encrypt_ticket_with_cipher_ctx(hs, out, session_buf,
                                              session_len);
  }
}